

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  pointer *pppcVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__;
  cmCommandContext *entryPointCommand;
  iterator __position;
  undefined4 uVar2;
  bool bVar3;
  cmMakefile *pcVar4;
  undefined3 in_register_00000081;
  cmMakefile *subMf;
  Snapshot newSnapshot;
  cmMakefile *local_80;
  undefined4 local_74;
  undefined1 local_70 [16];
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> local_60;
  
  bVar3 = EnforceUniqueDir(this,srcPath,binPath);
  if (bVar3) {
    entryPointCommand =
         (this->ContextStack).
         super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
    __return_storage_ptr__ = &local_60.UpPositions;
    local_74 = CONCAT31(in_register_00000081,immediate);
    cmState::CreateBuildsystemDirectorySnapshot
              ((Snapshot *)__return_storage_ptr__,this->GlobalGenerator->CMakeInstance->State,
               this->StateSnapshot,&entryPointCommand->Name,entryPointCommand->Line);
    cmState::Snapshot::GetDirectory((Directory *)local_70,(Snapshot *)__return_storage_ptr__);
    cmState::Directory::SetCurrentSource((Directory *)local_70,srcPath);
    cmState::Snapshot::GetDirectory((Directory *)local_70,(Snapshot *)__return_storage_ptr__);
    cmState::Directory::SetCurrentBinary((Directory *)local_70,binPath);
    cmsys::SystemTools::MakeDirectory((binPath->_M_dataplus)._M_p);
    pcVar4 = (cmMakefile *)operator_new(0x730);
    cmMakefile(pcVar4,this->GlobalGenerator,(Snapshot *)__return_storage_ptr__);
    local_80 = pcVar4;
    cmGlobalGenerator::AddMakefile(this->GlobalGenerator,pcVar4);
    uVar2 = local_74;
    pcVar4 = local_80;
    if (excludeFromAll) {
      local_70._0_8_ = &local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"EXCLUDE_FROM_ALL","");
      SetProperty(pcVar4,(string *)local_70,"TRUE");
      if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_70._0_8_ != &local_60) {
        operator_delete((void *)local_70._0_8_,
                        (ulong)((long)local_60.Data.
                                      super__Vector_base<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
    }
    if ((char)uVar2 == '\0') {
      __position._M_current =
           (this->UnConfiguredDirectories).
           super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->UnConfiguredDirectories).
          super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmMakefile*,std::allocator<cmMakefile*>>::_M_realloc_insert<cmMakefile*const&>
                  ((vector<cmMakefile*,std::allocator<cmMakefile*>> *)&this->UnConfiguredDirectories
                   ,__position,&local_80);
      }
      else {
        *__position._M_current = local_80;
        pppcVar1 = &(this->UnConfiguredDirectories).
                    super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
    else {
      ConfigureSubDirectory(this,local_80);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll,
                                 bool immediate)
{
  // Make sure the binary directory is unique.
  if(!this->EnforceUniqueDir(srcPath, binPath))
    {
    return;
    }

  cmState::Snapshot newSnapshot = this->GetState()
      ->CreateBuildsystemDirectorySnapshot(this->StateSnapshot,
                                           this->ContextStack.back()->Name,
                                           this->ContextStack.back()->Line);

  newSnapshot.GetDirectory().SetCurrentSource(srcPath);
  newSnapshot.GetDirectory().SetCurrentBinary(binPath);

  cmSystemTools::MakeDirectory(binPath.c_str());

  cmMakefile* subMf = new cmMakefile(this->GlobalGenerator, newSnapshot);
  this->GetGlobalGenerator()->AddMakefile(subMf);

  if(excludeFromAll)
    {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
    }

  if (immediate)
    {
    this->ConfigureSubDirectory(subMf);
    }
  else
    {
    this->UnConfiguredDirectories.push_back(subMf);
    }
}